

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

int disas_neon_ls_insn(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *s_01;
  MemOp MVar1;
  bool bVar2;
  uint uVar3;
  uintptr_t o_8;
  TCGTemp *pTVar4;
  TCGv_i64 val;
  TCGTemp *pTVar5;
  TCGv_i32 pTVar6;
  sbyte sVar7;
  MemOp MVar8;
  uint32_t oprsz;
  TCGv_ptr pTVar9;
  uint32_t dofs;
  uintptr_t o_7;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uintptr_t o_3;
  uint reg;
  TCGOpcode TVar13;
  int iVar14;
  int unaff_R12D;
  uint uVar15;
  int iVar16;
  TCGv_i32 pTVar17;
  MemOp MVar18;
  uintptr_t o_6;
  ulong uVar19;
  int ofs;
  ARMMMUIdx local_88;
  ulong local_80;
  uint local_54;
  int local_50;
  uint local_4c;
  
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,(uint32_t)s->pc_curr,1,0x1fe00020,s->fp_excp_el);
    return 0;
  }
  if (s->vfp_enabled != true) {
    return 1;
  }
  s_00 = s->uc->tcg_ctx;
  if ((s->isar->mvfr0 & 0xe) == 0) {
    if ((insn >> 0x16 & 1) != 0) {
      return 1;
    }
    local_4c = insn >> 0xc & 0xf;
  }
  else {
    local_4c = insn >> 0x12 & 0x10 | insn >> 0xc & 0xf;
  }
  local_80 = (ulong)local_4c;
  reg = insn >> 0x10 & 0xf;
  uVar12 = insn >> 8;
  if ((insn >> 0x17 & 1) == 0) {
    uVar3 = uVar12 & 0xf;
    if (10 < uVar3) {
      return 1;
    }
    local_88 = s->mmu_idx;
    if ((uVar12 & 0xc) == 8) {
      if ((~insn & 0x30) == 0) {
        return 1;
      }
    }
    else if (((uVar12 & 0xc) == 4) && ((insn & 0x20) != 0)) {
      return 1;
    }
    MVar8 = insn >> 6 & MO_64;
    iVar14 = neon_ls_element_type[uVar3].nregs;
    uVar12 = neon_ls_element_type[uVar3].interleave;
    uVar3 = neon_ls_element_type[uVar3].spacing;
    if ((MVar8 == MO_64) && ((uVar3 | uVar12) != 1)) {
      return 1;
    }
    MVar1 = s->be_data;
    if ((insn >> 6 & MO_64) == MO_8) {
      MVar1 = MVar8;
    }
    MVar18 = MO_64;
    if (uVar12 != 1 || MVar1 != MO_8) {
      MVar18 = MVar8;
    }
    local_50 = 0;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    val = (TCGv_i64)((long)pTVar4 - (long)s_00);
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar17 = (TCGv_i32)((long)pTVar5 - (long)s_00);
    sVar7 = (sbyte)MVar18;
    pTVar6 = tcg_const_i32_aarch64(s_00,1 << sVar7);
    load_reg_var(s,pTVar17,reg);
    if (0 < iVar14) {
      local_88 = local_88 & 0xf;
      local_4c = local_4c * 8;
      do {
        local_54 = 0;
        do {
          if (0 < (int)uVar12) {
            uVar19 = local_80;
            uVar15 = local_4c;
            uVar10 = uVar12;
            do {
              if ((insn >> 0x15 & 1) == 0) {
                switch(MVar8) {
                case MO_8:
                  TVar13 = INDEX_op_ld8u_i64;
                  break;
                case MO_16:
                  TVar13 = INDEX_op_ld16u_i64;
                  break;
                case MO_32:
                  TVar13 = INDEX_op_ld32u_i64;
                  break;
                default:
                  TVar13 = INDEX_op_ld_i64;
                }
                tcg_gen_op3_aarch64(s_00,TVar13,(TCGArg)pTVar4,(TCGArg)(s_00->cpu_env + (long)s_00),
                                    (ulong)((local_54 << sVar7) + (uVar15 & 8) + 0xc10) +
                                    (ulong)((uint)(uVar19 >> 1) & 0x3fffffff) * 0x100);
                gen_aa32_st_i64(s,val,pTVar17,local_88,MVar1 | MVar18);
              }
              else {
                gen_aa32_ld_i64(s,val,pTVar17,local_88,MVar1 | MVar18);
                switch(MVar8) {
                case MO_8:
                  pTVar9 = s_00->cpu_env + (long)s_00;
                  TVar13 = INDEX_op_st8_i64;
                  break;
                case MO_16:
                  pTVar9 = s_00->cpu_env + (long)s_00;
                  TVar13 = INDEX_op_st16_i64;
                  break;
                case MO_32:
                  pTVar9 = s_00->cpu_env + (long)s_00;
                  TVar13 = INDEX_op_st32_i64;
                  break;
                default:
                  pTVar9 = s_00->cpu_env + (long)s_00;
                  TVar13 = INDEX_op_st_i64;
                }
                tcg_gen_op3_aarch64(s_00,TVar13,(TCGArg)pTVar4,(TCGArg)pTVar9,
                                    (ulong)((local_54 << sVar7) + (uVar15 & 8) + 0xc10) +
                                    (ulong)((uint)(uVar19 >> 1) & 0x3fffffff) * 0x100);
              }
              tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)pTVar5,(TCGArg)pTVar5,
                                  (TCGArg)(pTVar6 + (long)s_00));
              uVar15 = uVar15 + uVar3 * 8;
              uVar19 = (ulong)((int)uVar19 + uVar3);
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
          }
          local_54 = local_54 + 1;
        } while (local_54 != 8U >> sVar7);
        local_50 = local_50 + 1;
        local_4c = local_4c + 8;
        local_80 = (ulong)((int)local_80 + 1);
      } while (local_50 != iVar14);
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar17 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar6 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(val + (long)s_00));
    unaff_R12D = iVar14 * uVar12 * 8;
    goto LAB_00649328;
  }
  MVar8 = insn >> 10 & MO_64;
  uVar3 = insn >> 4;
  switch(MVar8) {
  case MO_8:
    uVar15 = insn >> 5 & 7;
    unaff_R12D = 1;
    iVar14 = (uVar12 & 3) + 1;
    switch(uVar12 & 3) {
    case 0:
      goto switchD_00648ac3_caseD_0;
    case 1:
switchD_00648ac3_caseD_1:
      if ((insn & 0x20) == 0 || MVar8 != MO_32) goto LAB_00648b99;
      break;
    case 2:
switchD_00648ac3_caseD_2:
      if ((insn & 0x10) == 0) goto switchD_00648ac3_caseD_1;
      break;
    case 3:
switchD_00648ac3_caseD_3:
      if ((~insn & 0x30) == 0 && MVar8 == MO_32) break;
      goto LAB_00648b99;
    }
    goto LAB_00648bad;
  case MO_16:
    uVar15 = insn >> 6 & 3;
    unaff_R12D = 2 - (uint)((insn & 0x20) == 0);
    iVar14 = (uVar12 & 3) + 1;
    switch(uVar12 & 3) {
    case 1:
      goto switchD_00648ac3_caseD_1;
    case 2:
      goto switchD_00648ac3_caseD_2;
    case 3:
      goto switchD_00648ac3_caseD_3;
    }
    break;
  case MO_32:
    uVar15 = insn >> 7 & 1;
    unaff_R12D = 2 - (uint)((insn & 0x40) == 0);
    iVar14 = (uVar12 & 3) + 1;
    switch(uVar12 & 3) {
    case 1:
      goto switchD_00648ac3_caseD_1;
    case 2:
      goto switchD_00648ac3_caseD_2;
    case 3:
      goto switchD_00648ac3_caseD_3;
    }
    break;
  case MO_64:
    if ((insn >> 0x15 & 1) != 0) {
      MVar8 = insn >> 6 & MO_64;
      iVar14 = (uVar12 & 3) + 1;
      if ((MVar8 == MO_64) && (MVar8 = MO_32, (uVar3 & 1) == 0 || iVar14 != 4)) goto LAB_00648b16;
      if (((uVar3 & 1) != 0) && (MVar8 == MO_8 && (insn & 0x300) == 0 || iVar14 == 3))
      goto LAB_00648b16;
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar6 = (TCGv_i32)((long)pTVar4 - (long)s_00);
      load_reg_var(s,pTVar6,reg);
      iVar11 = 2 - (uint)((insn & 0x20) == 0);
      oprsz = 8;
      if ((insn & 0x300) == 0) {
        oprsz = iVar11 * 8;
      }
      pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
      pTVar17 = (TCGv_i32)((long)pTVar4 - (long)s_00);
      uVar12 = local_4c << 7;
      local_4c = local_4c * 8;
      iVar16 = iVar14;
      do {
        gen_aa32_ld_i32(s,pTVar17,pTVar6,s->mmu_idx & 0xf,s->be_data | MVar8);
        if (((local_80 & 1) == 0) || (oprsz != 0x10)) {
          tcg_gen_gvec_dup_i32_aarch64
                    (s_00,MVar8,(uVar12 & 0xffffff00) + (local_4c & 8) + 0xc10,oprsz,oprsz,pTVar17);
        }
        else {
          dofs = (uVar12 & 0xffffff00) + 0xc18;
          tcg_gen_gvec_dup_i32_aarch64(s_00,MVar8,dofs,8,8,pTVar17);
          tcg_gen_gvec_mov_aarch64(s_00,0,uVar12 + 0xc90,dofs,8,8);
        }
        tcg_gen_addi_i32_aarch64(s_00,pTVar6,pTVar6,1 << (sbyte)MVar8);
        local_80 = (ulong)(uint)((int)local_80 + iVar11);
        uVar12 = uVar12 + iVar11 * 0x80;
        local_4c = local_4c + iVar11 * 8;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar17 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar6 + (long)s_00));
      unaff_R12D = iVar14 << (sbyte)MVar8;
      goto LAB_00649311;
    }
LAB_00648b16:
    bVar2 = false;
    goto LAB_00649324;
  }
switchD_00648ac3_caseD_0:
  if (((uVar3 >> MVar8 & 1) == 0) && ((MVar8 != MO_32 || (1 < (uVar3 & 3) - 1)))) {
LAB_00648b99:
    if (0x1f < (int)(unaff_R12D * (uVar12 & 3) + local_4c)) goto LAB_00648bad;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar6 = (TCGv_i32)((long)pTVar4 - (long)s_00);
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    pTVar17 = (TCGv_i32)((long)pTVar5 - (long)s_00);
    load_reg_var(s,pTVar17,reg);
    sVar7 = (sbyte)MVar8;
    local_4c = local_4c * 8;
    iVar11 = (uVar12 & 3) + 1;
    do {
      if ((insn >> 0x15 & 1) == 0) {
        if ((insn >> 10 & MO_64) == MO_8) {
          TVar13 = INDEX_op_ld8u_i32;
        }
        else if (MVar8 == MO_32) {
          TVar13 = INDEX_op_ld_i32;
        }
        else {
          TVar13 = INDEX_op_ld16u_i32;
        }
        tcg_gen_op3_aarch64(s_00,TVar13,(TCGArg)pTVar4,(TCGArg)(s_00->cpu_env + (long)s_00),
                            (ulong)((local_4c & 8) + (uVar15 << sVar7)) +
                            (ulong)((uint)(local_80 >> 1) & 0x3fffffff) * 0x100 + 0xc10);
        gen_aa32_st_i32(s,pTVar6,pTVar17,s->mmu_idx & 0xf,s->be_data | MVar8);
      }
      else {
        gen_aa32_ld_i32(s,pTVar6,pTVar17,s->mmu_idx & 0xf,s->be_data | MVar8);
        if (MVar8 == MO_32) {
          pTVar9 = s_00->cpu_env + (long)s_00;
          TVar13 = INDEX_op_st_i32;
        }
        else if (MVar8 == MO_16) {
          pTVar9 = s_00->cpu_env + (long)s_00;
          TVar13 = INDEX_op_st16_i32;
        }
        else {
          pTVar9 = s_00->cpu_env + (long)s_00;
          TVar13 = INDEX_op_st8_i32;
        }
        tcg_gen_op3_aarch64(s_00,TVar13,(TCGArg)pTVar4,(TCGArg)pTVar9,
                            (ulong)((local_4c & 8) + (uVar15 << sVar7)) +
                            (ulong)((uint)(local_80 >> 1) & 0x3fffffff) * 0x100 + 0xc10);
      }
      local_80 = (ulong)(uint)((int)local_80 + unaff_R12D);
      tcg_gen_addi_i32_aarch64(s_00,pTVar17,pTVar17,1 << sVar7);
      local_4c = local_4c + unaff_R12D * 8;
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar17 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar6 + (long)s_00));
    unaff_R12D = iVar14 << sVar7;
LAB_00649311:
    bVar2 = true;
  }
  else {
LAB_00648bad:
    bVar2 = false;
  }
LAB_00649324:
  if (!bVar2) {
    return 1;
  }
LAB_00649328:
  uVar12 = insn & 0xf;
  if (uVar12 != 0xf) {
    s_01 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I32,false);
    pTVar6 = (TCGv_i32)((long)pTVar4 - (long)s_01);
    load_reg_var(s,pTVar6,reg);
    if (uVar12 == 0xd) {
      tcg_gen_addi_i32_aarch64(s_00,pTVar6,pTVar6,unaff_R12D);
    }
    else {
      pTVar17 = load_reg(s,uVar12);
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)((long)s_00 + (long)pTVar6),
                          (TCGArg)((long)s_00 + (long)pTVar6),(TCGArg)(pTVar17 + (long)s_00));
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar17 + (long)s_00));
    }
    store_reg(s,reg,pTVar6);
    return 0;
  }
  return 0;
}

Assistant:

static int disas_neon_ls_insn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd, rn, rm;
    int op;
    int nregs;
    int interleave;
    int spacing;
    int stride;
    int size;
    int reg;
    int load;
    int n;
    int vec_size;
    int mmu_idx;
    MemOp endian;
    TCGv_i32 addr;
    TCGv_i32 tmp;
    TCGv_i32 tmp2;
    TCGv_i64 tmp64;

    /* FIXME: this access check should not take precedence over UNDEF
     * for invalid encodings; we will generate incorrect syndrome information
     * for attempts to execute invalid vfp/neon encodings with FP disabled.
     */
    if (s->fp_excp_el) {
        gen_exception_insn(s, s->pc_curr, EXCP_UDEF,
                           syn_simd_access_trap(1, 0xe, false), s->fp_excp_el);
        return 0;
    }

    if (!s->vfp_enabled)
      return 1;
    VFP_DREG_D(rd, insn);
    rn = (insn >> 16) & 0xf;
    rm = insn & 0xf;
    load = (insn & (1 << 21)) != 0;
    endian = s->be_data;
    mmu_idx = get_mem_index(s);
    if ((insn & (1 << 23)) == 0) {
        /* Load store all elements.  */
        op = (insn >> 8) & 0xf;
        size = (insn >> 6) & 3;
        if (op > 10)
            return 1;
        /* Catch UNDEF cases for bad values of align field */
        switch (op & 0xc) {
        case 4:
            if (((insn >> 5) & 1) == 1) {
                return 1;
            }
            break;
        case 8:
            if (((insn >> 4) & 3) == 3) {
                return 1;
            }
            break;
        default:
            break;
        }
        nregs = neon_ls_element_type[op].nregs;
        interleave = neon_ls_element_type[op].interleave;
        spacing = neon_ls_element_type[op].spacing;
        if (size == 3 && (interleave | spacing) != 1) {
            return 1;
        }
        /* For our purposes, bytes are always little-endian.  */
        if (size == 0) {
            endian = MO_LE;
        }
        /* Consecutive little-endian elements from a single register
         * can be promoted to a larger little-endian operation.
         */
        if (interleave == 1 && endian == MO_LE) {
            size = 3;
        }
        tmp64 = tcg_temp_new_i64(tcg_ctx);
        addr = tcg_temp_new_i32(tcg_ctx);
        tmp2 = tcg_const_i32(tcg_ctx, 1 << size);
        load_reg_var(s, addr, rn);
        for (reg = 0; reg < nregs; reg++) {
            for (n = 0; n < 8 >> size; n++) {
                int xs;
                for (xs = 0; xs < interleave; xs++) {
                    int tt = rd + reg + spacing * xs;

                    if (load) {
                        gen_aa32_ld_i64(s, tmp64, addr, mmu_idx, endian | size);
                        neon_store_element64(tcg_ctx, tt, n, size, tmp64);
                    } else {
                        neon_load_element64(tcg_ctx, tmp64, tt, n, size);
                        gen_aa32_st_i64(s, tmp64, addr, mmu_idx, endian | size);
                    }
                    tcg_gen_add_i32(tcg_ctx, addr, addr, tmp2);
                }
            }
        }
        tcg_temp_free_i32(tcg_ctx, addr);
        tcg_temp_free_i32(tcg_ctx, tmp2);
        tcg_temp_free_i64(tcg_ctx, tmp64);
        stride = nregs * interleave * 8;
    } else {
        size = (insn >> 10) & 3;
        if (size == 3) {
            /* Load single element to all lanes.  */
            int a = (insn >> 4) & 1;
            if (!load) {
                return 1;
            }
            size = (insn >> 6) & 3;
            nregs = ((insn >> 8) & 3) + 1;

            if (size == 3) {
                if (nregs != 4 || a == 0) {
                    return 1;
                }
                /* For VLD4 size==3 a == 1 means 32 bits at 16 byte alignment */
                size = 2;
            }
            if (nregs == 1 && a == 1 && size == 0) {
                return 1;
            }
            if (nregs == 3 && a == 1) {
                return 1;
            }
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);

            /* VLD1 to all lanes: bit 5 indicates how many Dregs to write.
             * VLD2/3/4 to all lanes: bit 5 indicates register stride.
             */
            stride = (insn & (1 << 5)) ? 2 : 1;
            vec_size = nregs == 1 ? stride * 8 : 8;

            tmp = tcg_temp_new_i32(tcg_ctx);
            for (reg = 0; reg < nregs; reg++) {
                gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                s->be_data | size);
                if ((rd & 1) && vec_size == 16) {
                    /* We cannot write 16 bytes at once because the
                     * destination is unaligned.
                     */
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         8, 8, tmp);
                    tcg_gen_gvec_mov(tcg_ctx, 0, neon_reg_offset(rd + 1, 0),
                                     neon_reg_offset(rd, 0), 8, 8);
                } else {
                    tcg_gen_gvec_dup_i32(tcg_ctx, size, neon_reg_offset(rd, 0),
                                         vec_size, vec_size, tmp);
                }
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
                rd += stride;
            }
            tcg_temp_free_i32(tcg_ctx, tmp);
            tcg_temp_free_i32(tcg_ctx, addr);
            stride = (1 << size) * nregs;
        } else {
            /* Single element.  */
            int idx = (insn >> 4) & 0xf;
            int reg_idx;
            switch (size) {
            case 0:
                reg_idx = (insn >> 5) & 7;
                stride = 1;
                break;
            case 1:
                reg_idx = (insn >> 6) & 3;
                stride = (insn & (1 << 5)) ? 2 : 1;
                break;
            case 2:
                reg_idx = (insn >> 7) & 1;
                stride = (insn & (1 << 6)) ? 2 : 1;
                break;
            default:
                abort();
            }
            nregs = ((insn >> 8) & 3) + 1;
            /* Catch the UNDEF cases. This is unavoidably a bit messy. */
            switch (nregs) {
            case 1:
                if (((idx & (1 << size)) != 0) ||
                    (size == 2 && ((idx & 3) == 1 || (idx & 3) == 2))) {
                    return 1;
                }
                break;
            case 3:
                if ((idx & 1) != 0) {
                    return 1;
                }
                /* fall through */
            case 2:
                if (size == 2 && (idx & 2) != 0) {
                    return 1;
                }
                break;
            case 4:
                if ((size == 2) && ((idx & 3) == 3)) {
                    return 1;
                }
                break;
            default:
                abort();
            }
            if ((rd + stride * (nregs - 1)) > 31) {
                /* Attempts to write off the end of the register file
                 * are UNPREDICTABLE; we choose to UNDEF because otherwise
                 * the neon_load_reg() would write off the end of the array.
                 */
                return 1;
            }
            tmp = tcg_temp_new_i32(tcg_ctx);
            addr = tcg_temp_new_i32(tcg_ctx);
            load_reg_var(s, addr, rn);
            for (reg = 0; reg < nregs; reg++) {
                if (load) {
                    gen_aa32_ld_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                    neon_store_element(tcg_ctx, rd, reg_idx, size, tmp);
                } else { /* Store */
                    neon_load_element(tcg_ctx, tmp, rd, reg_idx, size);
                    gen_aa32_st_i32(s, tmp, addr, get_mem_index(s),
                                    s->be_data | size);
                }
                rd += stride;
                tcg_gen_addi_i32(tcg_ctx, addr, addr, 1 << size);
            }
            tcg_temp_free_i32(tcg_ctx, addr);
            tcg_temp_free_i32(tcg_ctx, tmp);
            stride = nregs * (1 << size);
        }
    }
    if (rm != 15) {
        TCGv_i32 base;

        base = load_reg(s, rn);
        if (rm == 13) {
            tcg_gen_addi_i32(tcg_ctx, base, base, stride);
        } else {
            TCGv_i32 index;
            index = load_reg(s, rm);
            tcg_gen_add_i32(tcg_ctx, base, base, index);
            tcg_temp_free_i32(tcg_ctx, index);
        }
        store_reg(s, rn, base);
    }
    return 0;
}